

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

APInt __thiscall llvm::detail::IEEEFloat::convertPPCDoubleDoubleAPFloatToAPInt(IEEEFloat *this)

{
  opStatus oVar1;
  undefined8 extraout_RDX;
  IEEEFloat *in_RSI;
  IEEEFloat *pIVar2;
  APInt AVar3;
  ArrayRef<unsigned_long> bigVal;
  bool losesInfo;
  uint64_t words [2];
  IEEEFloat u;
  IEEEFloat v;
  IEEEFloat extended;
  fltSemantics extendedSemantics;
  bool local_99;
  fltSemantics *local_98;
  fltSemantics *local_90;
  IEEEFloat local_80;
  IEEEFloat local_68;
  IEEEFloat local_50;
  fltSemantics local_38;
  IEEEFloat *local_28;
  Significand local_20;
  
  if (in_RSI->semantics != (fltSemantics *)semPPCDoubleDoubleLegacy) {
    __assert_fail("semantics == (const llvm::fltSemantics *)&semPPCDoubleDoubleLegacy",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xb0e,
                  "APInt llvm::detail::IEEEFloat::convertPPCDoubleDoubleAPFloatToAPInt() const");
  }
  local_38.sizeInBits = 0x80;
  local_38.maxExponent = 0x3ff;
  local_38.minExponent = -0x3fe;
  local_38.precision = 0x6a;
  IEEEFloat(&local_50,in_RSI);
  oVar1 = convert(&local_50,&local_38,rmNearestTiesToEven,&local_99);
  if ((oVar1 != opOK) || ((local_99 & 1U) != 0)) {
    __assert_fail("fs == opOK && !losesInfo",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xb1f,
                  "APInt llvm::detail::IEEEFloat::convertPPCDoubleDoubleAPFloatToAPInt() const");
  }
  IEEEFloat(&local_80,&local_50);
  oVar1 = convert(&local_80,(fltSemantics *)semIEEEdouble,rmNearestTiesToEven,&local_99);
  if ((oVar1 & (opUnderflow|opOverflow|opDivByZero|opInvalidOp)) != opOK) {
    __assert_fail("fs == opOK || fs == opInexact",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xb24,
                  "APInt llvm::detail::IEEEFloat::convertPPCDoubleDoubleAPFloatToAPInt() const");
  }
  convertDoubleAPFloatToAPInt(&local_68);
  pIVar2 = &local_68;
  if (0x40 < (uint)local_68.significand.part._0_4_) {
    pIVar2 = (IEEEFloat *)local_68.semantics;
  }
  local_98 = pIVar2->semantics;
  if ((IEEEFloat *)local_68.semantics != (IEEEFloat *)0x0 &&
      0x40 < (uint)local_68.significand.part._0_4_) {
    operator_delete__(local_68.semantics);
  }
  if (((local_80._18_1_ & 7) == 3 || (local_80._18_1_ & 6) == 0) || (local_99 != true)) {
    local_90 = (fltSemantics *)0x0;
  }
  else {
    oVar1 = convert(&local_80,&local_38,rmNearestTiesToEven,&local_99);
    if ((oVar1 != opOK) || ((local_99 & 1U) != 0)) {
      __assert_fail("fs == opOK && !losesInfo",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xb2e,
                    "APInt llvm::detail::IEEEFloat::convertPPCDoubleDoubleAPFloatToAPInt() const");
    }
    IEEEFloat(&local_68,&local_50);
    addOrSubtract(&local_68,&local_80,rmNearestTiesToEven,true);
    oVar1 = convert(&local_68,(fltSemantics *)semIEEEdouble,rmNearestTiesToEven,&local_99);
    if ((oVar1 != opOK) || ((local_99 & 1U) != 0)) {
      __assert_fail("fs == opOK && !losesInfo",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xb34,
                    "APInt llvm::detail::IEEEFloat::convertPPCDoubleDoubleAPFloatToAPInt() const");
    }
    convertDoubleAPFloatToAPInt((IEEEFloat *)&local_28);
    pIVar2 = (IEEEFloat *)&local_28;
    if (0x40 < (uint)local_20.part._0_4_) {
      pIVar2 = local_28;
    }
    local_90 = pIVar2->semantics;
    if (local_28 != (IEEEFloat *)0x0 && 0x40 < (uint)local_20.part._0_4_) {
      operator_delete__(local_28);
    }
    ~IEEEFloat(&local_68);
  }
  bigVal.Length = 2;
  bigVal.Data = (unsigned_long *)&local_98;
  APInt::APInt((APInt *)this,0x80,bigVal);
  ~IEEEFloat(&local_80);
  ~IEEEFloat(&local_50);
  AVar3._8_8_ = extraout_RDX;
  AVar3.U.pVal = (uint64_t *)this;
  return AVar3;
}

Assistant:

APInt IEEEFloat::convertPPCDoubleDoubleAPFloatToAPInt() const {
  assert(semantics == (const llvm::fltSemantics *)&semPPCDoubleDoubleLegacy);
  assert(partCount()==2);

  uint64_t words[2];
  opStatus fs;
  bool losesInfo;

  // Convert number to double.  To avoid spurious underflows, we re-
  // normalize against the "double" minExponent first, and only *then*
  // truncate the mantissa.  The result of that second conversion
  // may be inexact, but should never underflow.
  // Declare fltSemantics before APFloat that uses it (and
  // saves pointer to it) to ensure correct destruction order.
  fltSemantics extendedSemantics = *semantics;
  extendedSemantics.minExponent = semIEEEdouble.minExponent;
  IEEEFloat extended(*this);
  fs = extended.convert(extendedSemantics, rmNearestTiesToEven, &losesInfo);
  assert(fs == opOK && !losesInfo);
  (void)fs;

  IEEEFloat u(extended);
  fs = u.convert(semIEEEdouble, rmNearestTiesToEven, &losesInfo);
  assert(fs == opOK || fs == opInexact);
  (void)fs;
  words[0] = *u.convertDoubleAPFloatToAPInt().getRawData();

  // If conversion was exact or resulted in a special case, we're done;
  // just set the second double to zero.  Otherwise, re-convert back to
  // the extended format and compute the difference.  This now should
  // convert exactly to double.
  if (u.isFiniteNonZero() && losesInfo) {
    fs = u.convert(extendedSemantics, rmNearestTiesToEven, &losesInfo);
    assert(fs == opOK && !losesInfo);
    (void)fs;

    IEEEFloat v(extended);
    v.subtract(u, rmNearestTiesToEven);
    fs = v.convert(semIEEEdouble, rmNearestTiesToEven, &losesInfo);
    assert(fs == opOK && !losesInfo);
    (void)fs;
    words[1] = *v.convertDoubleAPFloatToAPInt().getRawData();
  } else {
    words[1] = 0;
  }

  return APInt(128, words);
}